

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

void Vec_IntSelectSortCost2Reverse(int *pArray,int nSize,int *pCosts)

{
  int iVar1;
  int t_1;
  int t;
  int best_i;
  int j;
  int i;
  int *pCosts_local;
  int nSize_local;
  int *pArray_local;
  
  for (best_i = 0; best_i < nSize + -1; best_i = best_i + 1) {
    t_1 = best_i;
    t = best_i;
    while (t = t + 1, t < nSize) {
      if (pCosts[t_1] < pCosts[t]) {
        t_1 = t;
      }
    }
    iVar1 = pArray[best_i];
    pArray[best_i] = pArray[t_1];
    pArray[t_1] = iVar1;
    iVar1 = pCosts[best_i];
    pCosts[best_i] = pCosts[t_1];
    pCosts[t_1] = iVar1;
  }
  return;
}

Assistant:

static inline void Vec_IntSelectSortCost2Reverse( int * pArray, int nSize, int * pCosts )
{
    int i, j, best_i;
    for ( i = 0; i < nSize-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < nSize; j++ )
            if ( pCosts[j] > pCosts[best_i] )
                best_i = j;
        ABC_SWAP( int, pArray[i], pArray[best_i] );
        ABC_SWAP( int, pCosts[i], pCosts[best_i] );
    }
}